

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O3

__pid_t __thiscall kj::_::Mutex::wait(Mutex *this,void *__stat_loc)

{
  char cVar1;
  int iVar2;
  int extraout_EAX;
  long lVar3;
  char *in_RDX;
  long *plVar4;
  bool bVar5;
  bool currentlyLocked;
  timespec now;
  DebugComparison<kj::Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>_&,_const_kj::None_&>
  _kjCondition;
  undefined8 in_stack_fffffffffffffef8;
  bool local_f2;
  LockSourceLocationArg local_f1;
  timespec local_f0;
  Fault local_e0;
  DebugComparison<kj::Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>_&,_const_kj::None_&>
  local_d8;
  Waiter local_a8;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:410:3)>
  local_78;
  undefined1 local_50;
  long local_40;
  long local_38;
  
  local_78.maybeFunc.ptr.field_1.value.waiter = &local_a8;
  local_a8.next.ptr = (Waiter *)0x0;
  local_a8.prev = this->waitersTail;
  local_a8.exception.ptr.disposer = (Disposer *)0x0;
  local_a8.exception.ptr.ptr = (Exception *)0x0;
  local_a8.futex = 0;
  local_a8.hasTimeout = (bool)*in_RDX;
  (local_a8.prev)->ptr = local_78.maybeFunc.ptr.field_1.value.waiter;
  this->waitersTail = &(local_78.maybeFunc.ptr.field_1.value.waiter)->next;
  local_78.maybeFunc.ptr.field_1.value.currentlyLocked = &local_f2;
  local_f2 = true;
  local_78.maybeFunc.ptr.isSet = true;
  local_78.maybeFunc.ptr.field_1.value.location = &local_f1;
  local_a8.predicate = (Predicate *)__stat_loc;
  local_78.maybeFunc.ptr.field_1.value.this = this;
  cVar1 = (*(code *)**__stat_loc)(__stat_loc);
  if (cVar1 == '\0') {
    unlock(this,EXCLUSIVE,&local_a8);
    local_f2 = false;
    if (*in_RDX == '\x01') {
      do {
        iVar2 = clock_gettime(1,&local_f0);
        if (-1 < iVar2) goto LAB_001b2892;
        iVar2 = Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        local_e0.exception = (Exception *)0x0;
        local_d8.left = (Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)0x0;
        local_d8.right = (None *)0x0;
        Debug::Fault::init(&local_e0,
                           (EVP_PKEY_CTX *)
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                          );
        Debug::Fault::fatal(&local_e0);
      }
LAB_001b2892:
      local_38 = local_f0.tv_sec * 1000000000 + local_f0.tv_nsec + *(long *)(in_RDX + 8);
      local_40 = local_38 / 1000000000;
      local_38 = local_38 % 1000000000;
      plVar4 = &local_40;
    }
    else {
      plVar4 = (long *)0x0;
    }
LAB_001b28f5:
    do {
      in_stack_fffffffffffffef8 =
           CONCAT44((int)((ulong)in_stack_fffffffffffffef8 >> 0x20),0xffffffff);
      lVar3 = syscall(0xca,&local_a8.futex,0x89,0,plVar4,0,in_stack_fffffffffffffef8);
      if (lVar3 < 0) {
        iVar2 = Debug::getOsErrorNumber(false);
        if (iVar2 < 0xb) {
          if (iVar2 == -1) goto LAB_001b28f5;
          if (iVar2 != 0) {
LAB_001b2a4d:
            local_f0.tv_sec = 0;
            local_d8.left = (Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)0x0;
            local_d8.right = (None *)0x0;
            Debug::Fault::init((Fault *)&local_f0,
                               (EVP_PKEY_CTX *)
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                              );
            Debug::Fault::fatal((Fault *)&local_f0);
          }
        }
        else if (iVar2 != 0xb) {
          if (iVar2 != 0x6e) goto LAB_001b2a4d;
          local_d8.result = (bool)*in_RDX;
          local_d8.right = (None *)&none;
          local_d8.op.content.ptr = " != ";
          local_d8.op.content.size_ = 5;
          if (local_d8.result == false) {
            Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::None_const&>&>
                      ((Fault *)&local_f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                       ,0x1c0,FAILED,"timeout != kj::none","_kjCondition,",&local_d8);
            Debug::Fault::fatal((Fault *)&local_f0);
          }
          LOCK();
          bVar5 = local_a8.futex == 0;
          if (bVar5) {
            local_a8.futex = 1;
          }
          UNLOCK();
          if (bVar5) {
            local_50 = 0;
            lock(this,0);
            local_f2 = true;
            goto LAB_001b29c3;
          }
        }
      }
    } while (local_a8.futex == 0);
    local_f2 = true;
    if (local_a8.exception.ptr.ptr != (Exception *)0x0) {
      throwFatalException(local_a8.exception.ptr.ptr,0);
    }
  }
LAB_001b29c3:
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:410:3)>
  ::~Deferred(&local_78);
  iVar2 = extraout_EAX;
  if (local_a8.exception.ptr.ptr != (Exception *)0x0) {
    local_a8.exception.ptr.ptr = (Exception *)0x0;
    iVar2 = (**(local_a8.exception.ptr.disposer)->_vptr_Disposer)();
  }
  return iVar2;
}

Assistant:

void Mutex::wait(Predicate& predicate, Maybe<Duration> timeout, LockSourceLocationArg location) {
  // Add waiter to list.
  Waiter waiter { kj::none, waitersTail, predicate, kj::none, 0, timeout != kj::none };
  addWaiter(waiter);

  BlockedOnReason blockReason = BlockedOnCondVarWait{*this, &waiter, location};
  KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

  // To guarantee that we've re-locked the mutex before scope exit, keep track of whether it is
  // currently.
  bool currentlyLocked = true;
  KJ_DEFER({
    // Infinite timeout for re-obtaining the lock is on purpose because the post-condition for this
    // function has to be that the lock state hasn't changed (& we have to be locked when we enter
    // since that's how condvars work).
    if (!currentlyLocked) lock(EXCLUSIVE, kj::none, location);
    removeWaiter(waiter);
  });

  if (!predicate.check()) {
    unlock(EXCLUSIVE, &waiter);
    currentlyLocked = false;

    struct timespec ts;
    struct timespec* tsp = nullptr;
    KJ_IF_SOME(t, timeout) {
      ts = toAbsoluteTimespec(now() + t);
      tsp = &ts;
    }

    setCurrentThreadIsWaitingFor(&blockReason);

    // Wait for someone to set our futex to 1.
    for (;;) {
      // Note we use FUTEX_WAIT_BITSET_PRIVATE + FUTEX_BITSET_MATCH_ANY to get the same effect as
      // FUTEX_WAIT_PRIVATE except that the timeout is specified as an absolute time based on
      // CLOCK_MONOTONIC. Otherwise, FUTEX_WAIT_PRIVATE interprets it as a relative time, forcing
      // us to recompute the time after every iteration.
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_futex,
          &waiter.futex, FUTEX_WAIT_BITSET_PRIVATE, 0, tsp, nullptr, FUTEX_BITSET_MATCH_ANY)) {
        case EAGAIN:
          // Indicates that the futex was already non-zero by the time the kernel looked at it.
          // Not an error.
          break;
        case ETIMEDOUT: {
          // Wait timed out. This leaves us in a bit of a pickle: Ownership of the mutex was not
          // transferred to us from another thread. So, we need to lock it ourselves. But, another
          // thread might be in the process of signaling us and transferring ownership. So, we
          // first must atomically take control of our destiny.
          KJ_ASSERT(timeout != kj::none);
          uint expected = 0;
          if (__atomic_compare_exchange_n(&waiter.futex, &expected, 1, false,
                                          __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
            // OK, we set our own futex to 1. That means no other thread will, and so we won't be
            // receiving a mutex ownership transfer. We have to lock the mutex ourselves.
            setCurrentThreadIsNoLongerWaiting();
            lock(EXCLUSIVE, kj::none, location);
            currentlyLocked = true;
            return;
          } else {
            // Oh, someone else actually did signal us, apparently. Let's move on as if the futex
            // call told us so.
            break;
          }
        }
        default:
          KJ_FAIL_SYSCALL("futex(FUTEX_WAIT_PRIVATE)", error);
      }

      setCurrentThreadIsNoLongerWaiting();

      if (__atomic_load_n(&waiter.futex, __ATOMIC_ACQUIRE)) {
        // We received a lock ownership transfer from another thread.
        currentlyLocked = true;

        // The other thread checked the predicate before the transfer.
#ifdef KJ_DEBUG
        assertLockedByCaller(EXCLUSIVE);
#endif

        KJ_IF_SOME(exception, waiter.exception) {
          // The predicate threw an exception, apparently. Propagate it.
          // TODO(someday): Could we somehow have this be a recoverable exception? Presumably we'd
          //   then want MutexGuarded::when() to skip calling the callback, but then what should it
          //   return, since it normally returns the callback's result? Or maybe people who disable
          //   exceptions just really should not write predicates that can throw.
          kj::throwFatalException(kj::mv(*exception));
        }

        return;
      }
    }
  }
}